

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::SaveCache(cmake *this,string *path)

{
  cmState *this_00;
  char *__s;
  cmMessenger *messenger;
  allocator<char> local_61;
  string local_60;
  const_iterator local_40;
  char **entry;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  string *psStack_18;
  bool result;
  string *path_local;
  cmake *this_local;
  
  this_00 = this->State;
  psStack_18 = path;
  path_local = (string *)this;
  messenger = GetMessenger(this);
  __range1._7_1_ = cmState::SaveCache(this_00,path,messenger);
  __begin1 = (const_iterator)&SaveCache::entries;
  __end1 = std::initializer_list<const_char_*>::begin(&SaveCache::entries);
  entry = std::initializer_list<const_char_*>::end(&SaveCache::entries);
  for (; __end1 != entry; __end1 = __end1 + 1) {
    local_40 = __end1;
    __s = *__end1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
    UnwatchUnusedCli(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return (bool)(__range1._7_1_ & 1);
}

Assistant:

bool cmake::SaveCache(const std::string& path)
{
  bool result = this->State->SaveCache(path, this->GetMessenger());
  static const auto entries = { "CMAKE_CACHE_MAJOR_VERSION",
                                "CMAKE_CACHE_MINOR_VERSION",
                                "CMAKE_CACHE_PATCH_VERSION",
                                "CMAKE_CACHEFILE_DIR" };
  for (auto const& entry : entries) {
    this->UnwatchUnusedCli(entry);
  }
  return result;
}